

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_cast.hpp
# Opt level: O1

char duckdb::HandleVectorCastError::Operation<signed_char>
               (string *error_message,ValidityMask *mask,idx_t idx,VectorTryCastData *cast_data)

{
  ulong *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  TemplatedValidityData<unsigned_long> *pTVar5;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  idx_t local_20;
  
  HandleCastError::AssignError
            (error_message,cast_data->parameters->error_message,
             (optional_idx)(cast_data->parameters->query_location).index);
  cast_data->all_converted = false;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    local_20 = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
              ((duckdb *)&local_38,&local_20);
    p_Var4 = p_Stack_30;
    peVar3 = local_38;
    local_38 = (element_type *)0x0;
    p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
    (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar3;
    (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var4;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
    }
    pTVar5 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                       (&(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
    (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
         (unsigned_long *)
         (pTVar5->owned_data).
         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
         super__Head_base<0UL,_unsigned_long_*,_false>;
  }
  bVar2 = (byte)idx & 0x3f;
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask + (idx >> 6);
  *puVar1 = *puVar1 & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
  return -0x80;
}

Assistant:

static RESULT_TYPE Operation(const string &error_message, ValidityMask &mask, idx_t idx,
	                             VectorTryCastData &cast_data) {
		HandleCastError::AssignError(error_message, cast_data.parameters);
		cast_data.all_converted = false;
		mask.SetInvalid(idx);
		return NullValue<RESULT_TYPE>();
	}